

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testVec.cpp
# Opt level: O0

void anon_unknown.dwarf_97a80::testLength3T<double>(void)

{
  bool bVar1;
  double dVar2;
  Vec3<double> *this;
  Vec3<double> *this_00;
  double t;
  Vec3<double> v;
  double e;
  double s;
  undefined4 in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc5c;
  double in_stack_fffffffffffffc60;
  Vec3<double> *in_stack_fffffffffffffc68;
  Vec3<double> *in_stack_fffffffffffffc78;
  Vec3<double> local_348 [2];
  Vec3<double> local_318 [2];
  Vec3<double> local_2e8 [2];
  Vec3<double> local_2b8 [2];
  Vec3<double> local_288 [2];
  Vec3<double> local_258 [2];
  Vec3<double> local_228 [2];
  Vec3<double> local_1f8 [2];
  Vec3<double> local_1c8 [2];
  Vec3<double> local_198 [2];
  Vec3<double> local_168 [2];
  Vec3<double> local_138;
  double local_120;
  Vec3<double> local_100 [2];
  Vec3<double> local_d0 [2];
  Vec3<double> local_a0 [2];
  Vec3<double> local_70 [2];
  Vec3<double> local_40;
  Vec3<double> local_28;
  double local_10;
  double local_8;
  
  dVar2 = Imath_2_5::limits<double>::smallest();
  local_8 = Imath_2_5::Math<double>::sqrt(dVar2);
  local_10 = Imath_2_5::limits<double>::epsilon();
  local_10 = local_10 * 4.0;
  Imath_2_5::Vec3<double>::Vec3(&local_28);
  Imath_2_5::Vec3<double>::Vec3(&local_40,0.0,0.0,0.0);
  Imath_2_5::Vec3<double>::operator=(&local_28,&local_40);
  dVar2 = Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    __assert_fail("v.length() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x7a,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  dVar2 = Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    __assert_fail("v.normalized().length() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x7b,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::Vec3(local_70,3.0,4.0,0.0);
  Imath_2_5::Vec3<double>::operator=(&local_28,local_70);
  dVar2 = Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  if ((dVar2 != 5.0) || (NAN(dVar2))) {
    __assert_fail("v.length() == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x7e,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.16630236566788e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x7f,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::Vec3(local_a0,3000.0,4000.0,0.0);
  Imath_2_5::Vec3<double>::operator=(&local_28,local_a0);
  dVar2 = Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  if ((dVar2 != 5000.0) || (NAN(dVar2))) {
    __assert_fail("v.length() == 5000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x82,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.16732508155477e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x83,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::Vec3(local_d0,1.0,-1.0,1.0);
  Imath_2_5::Vec3<double>::operator=(&local_28,local_d0);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  Imath_2_5::Math<double>::sqrt(3.0);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.16811064593166e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), 1 * Math<T>::sqrt (3), e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x86,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.16856518632583e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x87,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::Vec3(local_100,1000.0,-1000.0,1000.0);
  Imath_2_5::Vec3<double>::operator=(&local_28,local_100);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  Imath_2_5::Math<double>::sqrt(3.0);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.16939027595439e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), 1000 * Math<T>::sqrt (3), 1000 * e)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x8a,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.16984481634856e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x8b,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  local_120 = local_8 * 16.0;
  Imath_2_5::Vec3<double>::Vec3(&local_138,local_120,0.0,0.0);
  Imath_2_5::Vec3<double>::operator=(&local_28,&local_138);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.17063038072545e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x90,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.17108492111962e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x91,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::Vec3(local_168,0.0,local_120,0.0);
  Imath_2_5::Vec3<double>::operator=(&local_28,local_168);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.17174202842859e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x93,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.17219656882277e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x94,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::Vec3(local_198,0.0,0.0,local_120);
  Imath_2_5::Vec3<double>::operator=(&local_28,local_198);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.17285367613173e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x96,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.17330821652591e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x97,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::Vec3(local_1c8,-local_120,-local_120,-local_120);
  Imath_2_5::Vec3<double>::operator=(&local_28,local_1c8);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  Imath_2_5::Math<double>::sqrt(3.0);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.17458290589218e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * Math<T>::sqrt (3), t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x99,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.17503744628635e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x9a,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  local_120 = local_8 / 16.0;
  Imath_2_5::Vec3<double>::Vec3(local_1f8,local_120,0.0,0.0);
  Imath_2_5::Vec3<double>::operator=(&local_28,local_1f8);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.17584277328907e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x9f,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.17629731368325e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xa0,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::Vec3(local_228,0.0,local_120,0.0);
  Imath_2_5::Vec3<double>::operator=(&local_28,local_228);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.17695442099222e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xa2,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.17740896138639e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xa3,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::Vec3(local_258,0.0,0.0,local_120);
  Imath_2_5::Vec3<double>::operator=(&local_28,local_258);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.17806606869536e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xa5,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::normalized(in_stack_fffffffffffffc78);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.17852060908953e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xa6,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::Vec3(local_288,-local_120,-local_120,-local_120);
  Imath_2_5::Vec3<double>::operator=(&local_28,local_288);
  this = (Vec3<double> *)Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  Imath_2_5::Math<double>::sqrt(3.0);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.1797952984558e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * Math<T>::sqrt (3), t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xa8,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::normalized(this);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.18024983884998e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xa9,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  local_120 = local_8 / 1048576.0;
  Imath_2_5::Vec3<double>::Vec3(local_2b8,local_120,0.0,0.0);
  Imath_2_5::Vec3<double>::operator=(&local_28,local_2b8);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.1810551658527e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xae,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::normalized(this);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.18150970624687e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xaf,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::Vec3(local_2e8,0.0,local_120,0.0);
  Imath_2_5::Vec3<double>::operator=(&local_28,local_2e8);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.18216681355584e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xb1,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::normalized(this);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.18262135395002e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xb2,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::Vec3(local_318,0.0,0.0,local_120);
  Imath_2_5::Vec3<double>::operator=(&local_28,local_318);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (in_stack_fffffffffffffc60,
                     (double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.18327846125898e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xb4,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::normalized(this);
  Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  bVar1 = Imath_2_5::equal<double,int,double>
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,8.18370335771441e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xb5,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::Vec3(local_348,-local_120,-local_120,-local_120);
  Imath_2_5::Vec3<double>::operator=(&local_28,local_348);
  this_00 = (Vec3<double> *)Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffc68);
  dVar2 = local_120;
  Imath_2_5::Math<double>::sqrt(3.0);
  bVar1 = Imath_2_5::equal<double,double,double>
                    (dVar2,(double)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                     8.18494840314193e-318);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * Math<T>::sqrt (3), t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xb7,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  Imath_2_5::Vec3<double>::normalized(this);
  Imath_2_5::Vec3<double>::length(this_00);
  bVar1 = Imath_2_5::equal<double,int,double>(dVar2,in_stack_fffffffffffffc5c,8.18537329959735e-318)
  ;
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0xb8,"void (anonymous namespace)::testLength3T() [T = double]");
  }
  return;
}

Assistant:

void
testLength3T ()
{
    const T s = Math<T>::sqrt (limits<T>::smallest());
    const T e = 4 * limits<T>::epsilon();

    Vec3<T> v;

    v = Vec3<T> (0, 0, 0);
    assert (v.length() == 0);
    assert (v.normalized().length() == 0);

    v = Vec3<T> (3, 4, 0);
    assert (v.length() == 5);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));

    v = Vec3<T> (3000, 4000, 0);
    assert (v.length() == 5000);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));

    v = Vec3<T> (1, -1, 1);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), 1 * Math<T>::sqrt (3), e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));

    v = Vec3<T> (1000, -1000, 1000);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), 1000 * Math<T>::sqrt (3), 1000 * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));

    T t = s * (1 << 4);

    v = Vec3<T> (t, 0, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec3<T> (0, t, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec3<T> (0, 0, t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec3<T> (-t, -t, -t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * Math<T>::sqrt (3), t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));

    t = s / (1 << 4);

    v = Vec3<T> (t, 0, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec3<T> (0, t, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec3<T> (0, 0, t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec3<T> (-t, -t, -t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * Math<T>::sqrt (3), t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));

    t = s / (1 << 20);

    v = Vec3<T> (t, 0, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec3<T> (0, t, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec3<T> (0, 0, t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec3<T> (-t, -t, -t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * Math<T>::sqrt (3), t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
}